

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0158(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_761;
  allocator<char> local_760;
  allocator<char> local_75f;
  allocator<char> local_75e;
  allocator<char> local_75d;
  allocator<char> local_75c;
  allocator<char> local_75b;
  allocator<char> local_75a;
  allocator<char> local_759;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658 [32];
  Expectation local_638;
  Expectation local_580;
  Decl local_4c8;
  Decl local_400;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"x y ( z const * w , u * v) { }",&local_759);
  Expectation::Expectation(&local_638);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"y",&local_75a);
  pDVar1 = Decl::Function(&local_1a8,&local_678,File);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"x",&local_75b);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_698,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"z",&local_75c);
  pDVar1 = Ty::Typedef(pTVar2,&local_6b8,Const);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"u",&local_75d);
  pDVar1 = Ty::Typedef(pTVar2,&local_6d8,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar3 = Expectation::declaration(&local_638,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"w",&local_75e);
  pDVar1 = Decl::Object(&local_338,&local_6f8,ParameterDeclaration,Block);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"z",&local_75f);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_718,Const);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_270);
  Decl::Decl(&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"v",&local_760);
  pDVar1 = Decl::Object(&local_4c8,&local_738,ParameterDeclaration,Block);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"u",&local_761);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_758,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_400,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_400);
  Expectation::Expectation(&local_580,pEVar3);
  bind(this,(int)local_658,(sockaddr *)&local_580,__len);
  Expectation::~Expectation(&local_580);
  Decl::~Decl(&local_400);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  Decl::~Decl(&local_4c8);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_6f8);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_638);
  std::__cxx11::string::~string(local_658);
  return;
}

Assistant:

void DeclarationBinderTester::case0158()
{
    bind("x y ( z const * w , u * v) { }",
         Expectation()
         .declaration(Decl()
                  .Function("y", ScopeKind::File)
                  .ty_.Typedef("x")
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("z",  CVR::Const)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.addParam().Typedef("u")
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("w", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                  .ty_.Typedef("z",  CVR::Const)
                  .ty_.Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("v", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                  .ty_.Typedef("u")
                  .ty_.Derived(TypeKind::Pointer)));
}